

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PpAtom.cpp
# Opt level: O2

void __thiscall glslang::TStringAtomMap::TStringAtomMap(TStringAtomMap *this)

{
  ulong in_RAX;
  long lVar1;
  undefined6 uStack_28;
  char t [2];
  
  _uStack_28 = in_RAX;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)this);
  TVector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_*>
  ::TVector(&this->stringMap);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  basic_string(&this->badToken);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::assign
            (&this->badToken,"<bad token>");
  _uStack_28 = _uStack_28 & 0xffffffffffffff;
  for (lVar1 = 0; lVar1 != 0x1a; lVar1 = lVar1 + 1) {
    _uStack_28 = CONCAT16("~!%^&*()-+=|,.<>/?;:[]{}#\\"[lVar1],uStack_28);
    addAtomFixed(this,t,(int)"~!%^&*()-+=|,.<>/?;:[]{}#\\"[lVar1]);
  }
  for (lVar1 = 8; lVar1 != 0x2a8; lVar1 = lVar1 + 0x10) {
    addAtomFixed(this,*(char **)((long)&::(anonymous_namespace)::tokens + lVar1),
                 *(int *)(&UNK_008a40e8 + lVar1));
  }
  this->nextAtom = 0xb7;
  return;
}

Assistant:

TStringAtomMap::TStringAtomMap()
{
    badToken.assign("<bad token>");

    // Add single character tokens to the atom table:
    const char* s = "~!%^&*()-+=|,.<>/?;:[]{}#\\";
    char t[2];

    t[1] = '\0';
    while (*s) {
        t[0] = *s;
        addAtomFixed(t, s[0]);
        s++;
    }

    // Add multiple character scanner tokens :
    for (size_t ii = 0; ii < sizeof(tokens)/sizeof(tokens[0]); ii++)
        addAtomFixed(tokens[ii].str, tokens[ii].val);

    nextAtom = PpAtomLast;
}